

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_serialize_to_file(JSON_Value *value,char *filename)

{
  int iVar1;
  char *__s;
  FILE *__stream;
  char *serialized_string;
  FILE *fp;
  JSON_Status return_code;
  char *filename_local;
  JSON_Value *value_local;
  
  fp._4_4_ = 0;
  __s = json_serialize_to_string(value);
  if (__s == (char *)0x0) {
    value_local._4_4_ = -1;
  }
  else {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      json_free_serialized_string(__s);
      value_local._4_4_ = -1;
    }
    else {
      iVar1 = fputs(__s,__stream);
      if (iVar1 == -1) {
        fp._4_4_ = -1;
      }
      iVar1 = fclose(__stream);
      if (iVar1 == -1) {
        fp._4_4_ = -1;
      }
      json_free_serialized_string(__s);
      value_local._4_4_ = fp._4_4_;
    }
  }
  return value_local._4_4_;
}

Assistant:

JSON_Status json_serialize_to_file(const JSON_Value *value, const char *filename) {
    JSON_Status return_code = JSONSuccess;
    FILE *fp = NULL;
    char *serialized_string = json_serialize_to_string(value);
    if (serialized_string == NULL) {
        return JSONFailure;
    }
    fp = fopen(filename, "w");
    if (fp == NULL) {
        json_free_serialized_string(serialized_string);
        return JSONFailure;
    }
    if (fputs(serialized_string, fp) == EOF) {
        return_code = JSONFailure;
    }
    if (fclose(fp) == EOF) {
        return_code = JSONFailure;
    }
    json_free_serialized_string(serialized_string);
    return return_code;
}